

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

void __thiscall slang::JsonWriter::startArray(JsonWriter *this)

{
  format_string<const_char_(&)[1],_int_&> fmt;
  long in_RDI;
  int *in_stack_00000018;
  char (*in_stack_00000020) [1];
  FormatBuffer *in_stack_00000028;
  size_t in_stack_00000038;
  char *in_stack_ffffffffffffffd8;
  FormatBuffer *in_stack_ffffffffffffffe0;
  string_view in_stack_ffffffffffffffe8;
  
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0xab1ee8)
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  FormatBuffer::append(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + *(int *)(in_RDI + 0xc);
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xab1f30);
    fmt.str.size_ = in_stack_00000038;
    fmt.str.data_ = (char *)this;
    FormatBuffer::format<char_const(&)[1],int&>
              (in_stack_00000028,fmt,in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void JsonWriter::startArray() {
    buffer->append("[");
    if (pretty) {
        currentIndent += indentSize;
        buffer->format("\n{:{}}", "", currentIndent);
    }
}